

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O2

void SubVerifyBase<long,unsigned_short>(char *types)

{
  bool bVar1;
  uint uVar2;
  pointer t;
  TestCase<long,_unsigned_short,_4> TVar3;
  allocator local_b9;
  ulong local_b8;
  char *local_b0;
  string msg;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  TestVector<long,_unsigned_short,_4> tests;
  
  tests.test_cases = (TestCase<long,_unsigned_short,_4> *)0x0;
  tests.count = 0;
  tests.current = 0;
  local_b0 = types;
  TVar3 = TestVector<long,_unsigned_short,_4>::GetNext(&tests);
  while( true ) {
    t = (pointer)TVar3.x;
    if (tests.count <= tests.current) break;
    local_b8 = TVar3._8_8_ & 0xffff;
    bVar1 = TVar3.fExpected;
    if (bVar1 != (long)((long)t - local_b8) <= (long)t) {
      std::__cxx11::string::string((string *)&local_88,"Error in case ",(allocator *)&local_68);
      std::operator+(&msg,&local_88,local_b0);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::string((string *)&local_88,msg._M_dataplus._M_p,(allocator *)&local_68);
      err_msg<long,unsigned_short>(&local_88,(long)t,(unsigned_short)local_b8,(bool)(bVar1 & 1));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p = t;
    SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
              ((SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&msg,(unsigned_short)local_b8);
    uVar2 = TVar3._10_4_ & 0xff;
    if (uVar2 != 1) {
      std::__cxx11::string::string((string *)&local_68,"Error in case ",&local_b9);
      std::operator+(&local_88,&local_68,local_b0);
      std::operator+(&msg,&local_88," throw (1): ");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::string((string *)&local_88,msg._M_dataplus._M_p,(allocator *)&local_68);
      err_msg<long,unsigned_short>(&local_88,(long)t,(unsigned_short)local_b8,(bool)(bVar1 & 1));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p = t;
    operator-=((long *)&msg,
               (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )TVar3.y);
    if (uVar2 != 1) {
      std::__cxx11::string::string((string *)&local_68,"Error in case ",&local_b9);
      std::operator+(&local_88,&local_68,local_b0);
      std::operator+(&msg,&local_88," throw (2): ");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::string((string *)&local_88,msg._M_dataplus._M_p,(allocator *)&local_68);
      err_msg<long,unsigned_short>(&local_88,(long)t,(unsigned_short)local_b8,(bool)(bVar1 & 1));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&msg);
    }
    TVar3 = TestVector<long,_unsigned_short,_4>::GetNext(&tests);
  }
  return;
}

Assistant:

void SubVerifyBase(const char* types)
{
    TestVector< T, U, OpType::Sub > tests;
    TestCase< T, U, OpType::Sub > test = tests.GetNext();

    while (!tests.Done())
    {
        T ret;
        if (SafeSubtract(test.x, test.y, ret) != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types;
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Now test throwing version
        bool fSuccess = true;
        try
        {
            SafeInt<T> si(test.x);
            si -= test.y;
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (1): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Also need to test the version that assigns back out
        // to a plain int, as it has different logic
        fSuccess = true;
        try
        {
            T x(test.x);
            x -= SafeInt<U>(test.y);
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (2): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        test = tests.GetNext();
    }
}